

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  __int32_t **pp_Var2;
  uint uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int f;
  int d;
  char str [3];
  int local_24;
  int local_20;
  char local_1b [3];
  
  _Var1 = getn("From (default=0): ",&local_20,0);
  iVar5 = 0;
  if (_Var1) {
    _Var1 = getn("To (default=1): ",&local_24,1);
    iVar5 = 0;
    if (_Var1) {
      if (local_24 < local_20) {
        puts("`To` must be bigger than `from`!");
        iVar5 = 1;
      }
      else {
        bVar6 = false;
        printf("[E]ven or [a]ny? [E/a]: ");
        fgets(local_1b,3,_stdin);
        lVar4 = (long)local_1b[0];
        if (lVar4 != 10) {
          pp_Var2 = __ctype_toupper_loc();
          bVar6 = (*pp_Var2)[lVar4] != 0x45;
        }
        uVar3 = 0;
        printf("Absolute? [y/N]: ");
        fgets(local_1b,3,_stdin);
        bVar7 = true;
        if (local_1b[0] == '\n') {
          pp_Var2 = __ctype_toupper_loc();
          bVar7 = (*pp_Var2)[10] == 0x59;
        }
        if (local_20 <= local_24) {
          uVar3 = 0;
          do {
            if ((byte)((bVar6 ^ 1U) & (byte)local_20) == 0) {
              iVar5 = -local_20;
              if (0 < local_20) {
                iVar5 = local_20;
              }
              if (!bVar7) {
                iVar5 = local_20;
              }
              uVar3 = uVar3 + iVar5;
            }
            local_20 = local_20 + 1;
          } while (local_24 + 1 != local_20);
        }
        iVar5 = 0;
        printf("The sum is %d\n",(ulong)uVar3);
      }
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int d, f;
  bool even, absolute;

  if (
    !getn("From (default=0): ", &d, 0)
    || !getn("To (default=1): ", &f, 1)
  ) {return 0;}

  if (d > f) {
    printf("`To` must be bigger than `from`!\n");
    return 1;
  }

  char str[3];
  printf("[E]ven or [a]ny? [E/a]: ");
  fgets(str, sizeof str, stdin);
  even = *str == '\n' || toupper(*str) == 'E';

  printf("Absolute? [y/N]: ");
  fgets(str, sizeof str, stdin);
  absolute = *str != '\n' || toupper(*str) == 'Y';

  int sum = 0;

  for (int i = d; i <= f; i++) {
    if (!even || i % 2 == 0) sum += absolute ? abs(i) : i;
  }

  printf("The sum is %d\n", sum);

  return 0;
}